

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::CharN
          (AsciiParser *this,size_t n,vector<char,_std::allocator<char>_> *nc)

{
  StreamReader *pSVar1;
  uint64_t uVar2;
  size_t nbytes;
  size_t __n;
  bool bVar3;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  ::std::vector<char,_std::allocator<char>_>::vector(&local_40,n,&local_41);
  pSVar1 = this->_sr;
  uVar2 = pSVar1->idx_;
  __n = pSVar1->length_ - uVar2;
  if (uVar2 + n <= pSVar1->length_) {
    __n = n;
  }
  bVar3 = __n - 1 < n;
  if (bVar3) {
    memcpy(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,pSVar1->binary_ + uVar2,__n);
    pSVar1->idx_ = pSVar1->idx_ + __n;
  }
  bVar3 = bVar3 && __n != 0;
  if (bVar3) {
    ::std::vector<char,_std::allocator<char>_>::operator=(nc,&local_40);
  }
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool AsciiParser::CharN(size_t n, std::vector<char> *nc) {
  std::vector<char> buf(n);

  bool ok = _sr->read(n, n, reinterpret_cast<uint8_t *>(buf.data()));
  if (ok) {
    (*nc) = buf;
  }

  return ok;
}